

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

int64_t CoreML::Specification::rankOf(ArrayFeatureType *marray)

{
  ArrayFeatureType_ShapeRange *pAVar1;
  ArrayFeatureType_EnumeratedShapes *pAVar2;
  RepeatedField<long> *pRVar3;
  
  if (marray->_oneof_case_[0] != 0) {
    if (marray->_oneof_case_[0] == 0x1f) {
      pAVar1 = ArrayFeatureType::shaperange(marray);
      pRVar3 = (RepeatedField<long> *)
               &(pAVar1->sizeranges_).super_RepeatedPtrFieldBase.current_size_;
      goto LAB_00582886;
    }
    pAVar2 = ArrayFeatureType::enumeratedshapes(marray);
    marray = (ArrayFeatureType *)
             google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                       (&(pAVar2->shapes_).super_RepeatedPtrFieldBase,0);
  }
  pRVar3 = &marray->shape_;
LAB_00582886:
  return (long)pRVar3->current_size_;
}

Assistant:

static inline int64_t rankOf(const Specification::ArrayFeatureType &marray) {
            switch (marray.ShapeFlexibility_case()) {
                case Specification::ArrayFeatureType::kEnumeratedShapes:
                    return marray.enumeratedshapes().shapes(0).shape_size();
                case  Specification::ArrayFeatureType::kShapeRange:
                    return marray.shaperange().sizeranges_size();
                case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                    return marray.shape_size();
            }
        }